

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::IStreamingReporter> * __thiscall
Catch::Ptr<Catch::IStreamingReporter>::operator=
          (Ptr<Catch::IStreamingReporter> *this,Ptr<Catch::IStreamingReporter> *other)

{
  IStreamingReporter *pIVar1;
  Ptr<Catch::IStreamingReporter> local_18;
  
  pIVar1 = other->m_p;
  if (pIVar1 != (IStreamingReporter *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
  }
  local_18 = (Ptr<Catch::IStreamingReporter>)this->m_p;
  this->m_p = pIVar1;
  ~Ptr(&local_18);
  return this;
}

Assistant:

Ptr& operator = ( Ptr const& other ){
            Ptr temp( other );
            swap( temp );
            return *this;
        }